

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passkey.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 uVar4;
  byte bVar5;
  int iVar6;
  llama_token lVar7;
  llama_context *plVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  common_log *pcVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  llama_model_params *plVar17;
  llama_context_params *plVar18;
  int *piVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  float fVar24;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  int local_1618 [2];
  int iStack_1610;
  undefined4 uStack_160c;
  undefined4 local_1608;
  undefined4 uStack_1604;
  undefined4 uStack_1600;
  undefined4 uStack_15fc;
  int local_15f8;
  undefined4 uStack_15f4;
  undefined4 uStack_15f0;
  undefined4 uStack_15ec;
  int8_t *local_15e8;
  allocator_type local_159d;
  uint local_159c;
  llama_context *local_1598;
  uint local_158c;
  ulong local_1588;
  int local_157c;
  ulong local_1578;
  long local_1570;
  uint local_1564;
  ulong local_1560;
  ulong local_1558;
  ulong local_1550;
  uint local_1544;
  llama_batch batch;
  vector<int,_std::allocator<int>_> tokens_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  string local_14a0;
  undefined8 local_1480;
  string prompt_suffix;
  string prompt_prefix;
  llama_context_params ctx_params;
  llama_model_params model_params;
  common_params params;
  
  bVar5 = 0;
  common_params::common_params(&params);
  params.n_junk = 0xfa;
  params.i_pos = -1;
  params.n_keep = 0x20;
  bVar3 = common_params_parse(argc,argv,&params,LLAMA_EXAMPLE_PASSKEY,print_usage);
  if (bVar3) {
    common_init();
    local_1570 = CONCAT44(local_1570._4_4_,params.n_junk);
    local_1550 = (ulong)(uint)params.n_keep;
    local_1588 = (ulong)(uint)params.grp_attn_n;
    local_157c = params.i_pos;
    if (params.i_pos == -1) {
      local_157c = rand();
      local_157c = local_157c % (int)local_1570;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prompt_prefix,
               "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there."
               ,(allocator<char> *)&ctx_params);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prompt_suffix," What is the pass key? The pass key is",
               (allocator<char> *)&ctx_params);
    std::__cxx11::string::_M_assign((string *)&params.prompt);
    iVar6 = rand();
    local_1564 = iVar6 % 50000 + 1;
    iVar15 = 0;
    iVar6 = 0;
    if (0 < (int)local_1570) {
      iVar6 = (int)local_1570;
    }
    for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
      if (iVar15 % (int)local_1570 == local_157c) {
        std::__cxx11::to_string((string *)&tokens_list,local_1564);
        std::operator+(&local_14c0," The pass key is ",(string *)&tokens_list);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&batch,
                       &local_14c0,". Remember it. ");
        std::__cxx11::to_string(&local_14a0,local_1564);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &model_params,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&batch,
                       &local_14a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ctx_params,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &model_params," is the pass key.");
        std::__cxx11::string::append((string *)&params.prompt);
        std::__cxx11::string::~string((string *)&ctx_params);
        std::__cxx11::string::~string((string *)&model_params);
        std::__cxx11::string::~string((string *)&local_14a0);
        std::__cxx11::string::~string((string *)&batch);
        std::__cxx11::string::~string((string *)&local_14c0);
        std::__cxx11::string::~string((string *)&tokens_list);
      }
      std::__cxx11::string::append((char *)&params.prompt);
    }
    std::__cxx11::string::append((string *)&params.prompt);
    llama_backend_init();
    llama_numa_init(params.numa);
    common_model_params_to_llama(&model_params,&params);
    plVar17 = &model_params;
    piVar19 = local_1618;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      *(ggml_backend_dev_t **)piVar19 = plVar17->devices;
      plVar17 = (llama_model_params *)((long)plVar17 + (ulong)bVar5 * -0x10 + 8);
      piVar19 = (int *)((long)piVar19 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    lVar13 = llama_model_load_from_file(params.model.path._M_dataplus._M_p);
    if (lVar13 == 0) {
      iVar6 = 1;
      if (-1 < common_log_verbosity_thold) {
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
      }
    }
    else {
      local_1480 = llama_model_get_vocab(lVar13);
      common_context_params_to_llama(&ctx_params,&params);
      iVar6 = llama_model_n_ctx_train(lVar13);
      ctx_params.n_ctx = iVar6 * (int)local_1588 + (int)local_1550;
      if ((int)((ulong)ctx_params.n_batch % (local_1588 & 0xffffffff)) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/passkey/passkey.cpp"
                   ,0x52,"GGML_ASSERT(%s) failed",
                   "ctx_params.n_batch % n_grp == 0 && \"n_batch must be divisible by n_grp\"");
      }
      plVar18 = &ctx_params;
      piVar19 = local_1618;
      for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
        *(undefined8 *)piVar19 = *(undefined8 *)plVar18;
        plVar18 = (llama_context_params *)((long)plVar18 + (ulong)bVar5 * -0x10 + 8);
        piVar19 = (int *)((long)piVar19 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      plVar8 = (llama_context *)llama_init_from_model(lVar13);
      if (plVar8 == (llama_context *)0x0) {
        iVar6 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                         "main");
        }
      }
      else {
        uVar4 = llama_sampler_chain_default_params();
        uVar9 = llama_sampler_chain_init(uVar4);
        uVar10 = llama_sampler_init_greedy();
        llama_sampler_chain_add(uVar9,uVar10);
        tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        common_tokenize((vector<int,_std::allocator<int>_> *)&batch,plVar8,&params.prompt,true,false
                       );
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&tokens_list,&batch);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&batch);
        common_tokenize((vector<int,_std::allocator<int>_> *)&batch,plVar8,&prompt_prefix,true,false
                       );
        lVar1 = CONCAT44(batch.token._4_4_,(int)batch.token);
        lVar14 = CONCAT44(batch._4_4_,batch.n_tokens);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&batch);
        uVar23 = (long)tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_159c = llama_n_ctx(plVar8);
        iVar6 = llama_n_ctx(plVar8);
        local_1560 = uVar23 >> 2;
        local_1544 = (int)local_1560 + 0x10;
        local_159c = local_159c - (int)local_1550;
        local_1578 = (ulong)(int)ctx_params.n_batch;
        local_158c = ctx_params.n_batch / (uint)local_1588;
        if (-1 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          local_15f8 = local_157c;
          uStack_1600 = (int)local_1570;
          local_1608 = (undefined4)local_1578;
          iStack_1610 = (int)local_1588;
          local_1618[0] = iVar6;
          common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,
                         "\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n"
                         ,"main",(ulong)local_1544,(ulong)local_159c);
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"\n");
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"prefix tokens: %d\n",
                             (ulong)(lVar1 - lVar14) >> 2 & 0xffffffff);
              if (-1 < common_log_verbosity_thold) {
                pcVar11 = common_log_main();
                common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"prompt tokens: %d\n",local_1560);
              }
            }
          }
        }
        llama_batch_init(&batch,params.n_batch,0,1);
        local_158c = local_158c * ((int)local_1588 + -1);
        uVar23 = 0;
        if (0 < (int)local_1578) {
          uVar23 = local_1578 & 0xffffffff;
        }
        lVar14 = (long)(int)local_1560;
        uVar12 = (ulong)(int)local_159c;
        uVar21 = 0;
        iVar15 = 0;
        local_1598 = plVar8;
        do {
          plVar8 = local_1598;
          if ((long)uVar12 <= (long)uVar21) break;
          local_1558 = uVar21;
          if (0 < (long)uVar21 && 1 < (int)(uint)local_1588) {
            iVar6 = ((int)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff)
                          / (long)(int)local_1578) + -1) * local_158c;
            iVar22 = iVar15 - (int)local_1578;
            llama_kv_self_seq_add(local_1598,0,iVar22,iVar15,iVar6);
            llama_kv_self_seq_div(plVar8,0,iVar22 + iVar6,iVar15 + iVar6);
            llama_kv_self_update(plVar8);
            iVar15 = llama_kv_self_seq_pos_max(plVar8);
            iVar15 = iVar15 + 1;
          }
          uVar21 = local_1558;
          common_batch_clear(&batch);
          uVar16 = uVar23;
          for (; (uVar2 = local_1558, bVar3 = uVar16 != 0, uVar16 = uVar16 - 1, bVar3 &&
                 ((long)uVar21 < lVar14)); uVar21 = uVar21 + 1) {
            lVar7 = tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21];
            local_14a0._M_dataplus._M_p._0_4_ = 0;
            __l._M_len = 1;
            __l._M_array = (iterator)&local_14a0;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_14c0,__l,&local_159d);
            common_batch_add(&batch,lVar7,iVar15,(vector<int,_std::allocator<int>_> *)&local_14c0,
                             false);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&local_14c0);
            iVar15 = iVar15 + 1;
          }
          uVar21 = local_1578 + local_1558;
          if (lVar14 <= (long)uVar21) {
            batch.logits[(long)batch.n_tokens + -1] = '\x01';
          }
          local_15e8 = batch.logits;
          local_15f8 = (int)batch.n_seq_id;
          uStack_15f4 = batch.n_seq_id._4_4_;
          uStack_15f0 = batch.seq_id._0_4_;
          uStack_15ec = batch.seq_id._4_4_;
          local_1608 = batch.embd._0_4_;
          uStack_1604 = batch.embd._4_4_;
          uStack_1600 = batch.pos._0_4_;
          uStack_15fc = batch.pos._4_4_;
          local_1618[0] = batch.n_tokens;
          local_1618[1] = batch._4_4_;
          iStack_1610 = (int)batch.token;
          uStack_160c = batch.token._4_4_;
          iVar6 = llama_decode(local_1598);
          if (iVar6 != 0) {
            if (common_log_verbosity_thold < 0) goto LAB_00130827;
            pcVar11 = common_log_main();
            iVar6 = 1;
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: llama_decode() failed\n","main");
            goto LAB_0013098d;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            uVar16 = local_1560;
            if ((int)uVar21 < (int)local_1560) {
              uVar16 = uVar21;
            }
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                           uVar2 & 0xffffffff,uVar16 & 0xffffffff);
          }
        } while ((long)uVar21 < lVar14);
        local_1588 = CONCAT44(local_1588._4_4_,(int)local_1550 + (int)local_1578);
        local_158c = -(int)local_1578;
        plVar8 = local_1598;
        while (local_1558 = uVar12, (long)uVar12 < lVar14) {
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: shifting KV cache with %d\n","main",
                           local_1578);
          }
          llama_kv_self_seq_rm(plVar8,0,local_1550,local_1588 & 0xffffffff);
          llama_kv_self_seq_add(plVar8,0,local_1588 & 0xffffffff,local_159c);
          llama_kv_self_update(plVar8);
          iVar15 = llama_kv_self_seq_pos_max(plVar8);
          common_batch_clear(&batch);
          uVar21 = local_1558;
          uVar12 = uVar23;
          while( true ) {
            plVar8 = local_1598;
            iVar15 = iVar15 + 1;
            bVar3 = uVar12 == 0;
            uVar12 = uVar12 - 1;
            if ((bVar3) || (lVar14 <= (long)uVar21)) break;
            lVar7 = tokens_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21];
            local_14a0._M_dataplus._M_p._0_4_ = 0;
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_14a0;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_14c0,__l_00,&local_159d);
            common_batch_add(&batch,lVar7,iVar15,(vector<int,_std::allocator<int>_> *)&local_14c0,
                             false);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&local_14c0);
            uVar21 = uVar21 + 1;
          }
          uVar12 = local_1558 + local_1578;
          if (lVar14 <= (long)uVar12) {
            batch.logits[(long)batch.n_tokens + -1] = '\x01';
          }
          local_15e8 = batch.logits;
          local_15f8 = (int)batch.n_seq_id;
          uStack_15f4 = batch.n_seq_id._4_4_;
          uStack_15f0 = batch.seq_id._0_4_;
          uStack_15ec = batch.seq_id._4_4_;
          local_1608 = batch.embd._0_4_;
          uStack_1604 = batch.embd._4_4_;
          uStack_1600 = batch.pos._0_4_;
          uStack_15fc = batch.pos._4_4_;
          local_1618[0] = batch.n_tokens;
          local_1618[1] = batch._4_4_;
          iStack_1610 = (int)batch.token;
          uStack_160c = batch.token._4_4_;
          iVar6 = llama_decode(local_1598);
          if (iVar6 != 0) {
            if (common_log_verbosity_thold < 0) {
LAB_00130827:
              iVar6 = 1;
            }
            else {
              pcVar11 = common_log_main();
              iVar6 = 1;
              common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: llama_decode() failed\n","main");
            }
            goto LAB_0013098d;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            uVar21 = local_1560;
            if ((int)uVar12 < (int)local_1560) {
              uVar21 = uVar12;
            }
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                           local_1558,uVar21 & 0xffffffff);
          }
        }
        iVar6 = iVar15 - local_159c;
        if (-0x10 < iVar6) {
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,
                           "%s: shifting KV cache with %d to free space for the answer\n","main",
                           (ulong)(iVar6 + 0x10U));
          }
          iVar15 = iVar6 + 0x10U + (int)local_1550;
          llama_kv_self_seq_rm(local_1598,0,local_1550,iVar15);
          llama_kv_self_seq_add(local_1598,0,iVar15,local_159c,-0x10 - iVar6);
          llama_kv_self_update(local_1598);
          iVar15 = llama_kv_self_seq_pos_max(local_1598);
          iVar15 = iVar15 + 1;
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"\n");
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            iStack_1610 = (local_157c * (int)local_1560) / (int)local_1570;
            local_1618[0] = (int)local_1570;
            common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,
                           "%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n",
                           "main",(ulong)local_1564);
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"\n");
              if (-1 < common_log_verbosity_thold) {
                pcVar11 = common_log_main();
                common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s",prompt_suffix._M_dataplus._M_p);
              }
            }
          }
        }
        local_1570 = ggml_time_us();
        iVar6 = 1;
        uVar20 = 0;
        do {
          if ((int)local_1544 < (int)((int)local_1560 + uVar20)) {
LAB_00130853:
            plVar8 = local_1598;
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_log_add(pcVar11,GGML_LOG_LEVEL_NONE,"\n");
            }
LAB_0013087f:
            lVar14 = ggml_time_us();
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              fVar24 = (float)(lVar14 - local_1570) / 1e+06;
              common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,
                             "%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
                             SUB84((double)fVar24,0),SUB84((double)((float)(int)uVar20 / fVar24),0),
                             "main",(ulong)uVar20);
              if (-1 < common_log_verbosity_thold) {
                pcVar11 = common_log_main();
                common_log_add(pcVar11,GGML_LOG_LEVEL_NONE,"\n");
              }
            }
            llama_perf_context_print(plVar8);
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_log_add(pcVar11,GGML_LOG_LEVEL_NONE,"\n");
            }
            llama_sampler_free(uVar9);
            local_15e8 = batch.logits;
            local_15f8 = (int)batch.n_seq_id;
            uStack_15f4 = batch.n_seq_id._4_4_;
            uStack_15f0 = batch.seq_id._0_4_;
            uStack_15ec = batch.seq_id._4_4_;
            local_1608 = batch.embd._0_4_;
            uStack_1604 = batch.embd._4_4_;
            uStack_1600 = batch.pos._0_4_;
            uStack_15fc = batch.pos._4_4_;
            local_1618[0] = batch.n_tokens;
            local_1618[1] = batch._4_4_;
            iStack_1610 = (int)batch.token;
            uStack_160c = batch.token._4_4_;
            llama_batch_free();
            llama_free(plVar8);
            llama_model_free(lVar13);
            iVar6 = 0;
            llama_backend_free();
            goto LAB_0013098d;
          }
          lVar7 = llama_sampler_sample(uVar9,local_1598,batch.n_tokens + -1);
          bVar5 = llama_vocab_is_eog(local_1480);
          if ((bVar5 | uVar20 == 0x10) == 1) {
            plVar8 = local_1598;
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_log_add(pcVar11,GGML_LOG_LEVEL_NONE,"\n");
              goto LAB_00130853;
            }
            goto LAB_0013087f;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            common_token_to_piece_abi_cxx11_(&local_14c0,local_1598,lVar7,true);
            common_log_add(pcVar11,GGML_LOG_LEVEL_NONE,"%s",local_14c0._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_14c0);
          }
          common_batch_clear(&batch);
          local_14a0._M_dataplus._M_p._0_4_ = 0;
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_14a0;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_14c0,__l_01,&local_159d);
          common_batch_add(&batch,lVar7,iVar15 + uVar20,
                           (vector<int,_std::allocator<int>_> *)&local_14c0,true);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_14c0);
          local_15e8 = batch.logits;
          local_15f8 = (int)batch.n_seq_id;
          uStack_15f4 = batch.n_seq_id._4_4_;
          uStack_15f0 = batch.seq_id._0_4_;
          uStack_15ec = batch.seq_id._4_4_;
          local_1608 = batch.embd._0_4_;
          uStack_1604 = batch.embd._4_4_;
          uStack_1600 = batch.pos._0_4_;
          uStack_15fc = batch.pos._4_4_;
          local_1618[0] = batch.n_tokens;
          local_1618[1] = batch._4_4_;
          iStack_1610 = (int)batch.token;
          uStack_160c = batch.token._4_4_;
          iVar22 = llama_decode(local_1598);
          uVar20 = uVar20 + 1;
        } while (iVar22 == 0);
        if (-1 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          iVar6 = 1;
          common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s : failed to eval, return code %d\n","main"
                         ,1);
        }
LAB_0013098d:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&tokens_list.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
    std::__cxx11::string::~string((string *)&prompt_suffix);
    std::__cxx11::string::~string((string *)&prompt_prefix);
  }
  else {
    iVar6 = 1;
  }
  common_params::~common_params(&params);
  return iVar6;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.n_junk = 250;
    params.n_keep = 32;
    params.i_pos  = -1;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_PASSKEY, print_usage)) {
        return 1;
    }

    common_init();

    int n_junk = params.n_junk;
    int n_keep = params.n_keep;
    int n_grp  = params.grp_attn_n;
    int i_pos  = params.i_pos;

    if (i_pos == -1) {
        i_pos = rand() % n_junk;
    }

    const std::string prompt_prefix = "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there.";
    const std::string prompt_suffix = " What is the pass key? The pass key is";

    // generate junk text
    params.prompt = prompt_prefix;

    const int passkey = rand() % 50000 + 1;

    for (int i = 0; i < n_junk; i++) {
        if (i % n_junk == i_pos) {
            params.prompt += " The pass key is " + std::to_string(passkey) + ". Remember it. " + std::to_string(passkey) + " is the pass key.";
        }

        params.prompt += " The grass is green. The sky is blue. The sun is yellow. Here we go. There and back again.";
    }

    params.prompt += prompt_suffix;

    // init LLM

    llama_backend_init();
    llama_numa_init(params.numa);

    // initialize the model

    llama_model_params model_params = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), model_params);

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context

    llama_context_params ctx_params = common_context_params_to_llama(params);

    ctx_params.n_ctx = llama_model_n_ctx_train(model)*n_grp + n_keep;

    GGML_ASSERT(ctx_params.n_batch % n_grp == 0 && "n_batch must be divisible by n_grp");

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (ctx == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return 1;
    }

    auto sparams = llama_sampler_chain_default_params();

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // tokenize the prompt
    std::vector<llama_token> tokens_list;
    tokens_list = common_tokenize(ctx, params.prompt, true);

    // tokenize the prefix and use it as a sink
    const int n_tokens_prefix = common_tokenize(ctx, prompt_prefix, true).size();

    const int n_tokens_all = tokens_list.size();

    // we leave a margin of 16 tokens for the generated text - it should contain just the passkey
    const int n_predict = 16;

    // total length of the sequences including the prompt
    const int n_len = n_tokens_all + n_predict;

    const int n_ctx       = llama_n_ctx(ctx) - n_keep;
    const int n_kv_req    = llama_n_ctx(ctx);
    const int n_batch     = ctx_params.n_batch;
    const int n_batch_grp = ctx_params.n_batch/n_grp;

    LOG_INF("\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n", __func__, n_len, n_ctx, n_kv_req, n_grp, n_batch, n_junk, i_pos);

    // print the prompt token-by-token

    LOG_INF("\n");
    LOG_INF("prefix tokens: %d\n", n_tokens_prefix);
    LOG_INF("prompt tokens: %d\n", n_tokens_all);
    //LOG_INF("prompt: %s\n", params.prompt.c_str());

    llama_batch batch = llama_batch_init(params.n_batch, 0, 1);

    int n_past = 0;

    // fill the KV cache
    for (int i = 0; i < n_ctx; i += n_batch) {
        if (i > 0 && n_grp > 1) {
            // if SelfExtend is enabled, we compress the position from the last batch by a factor of n_grp
            const int ib = i/n_batch - 1;
            const int bd = n_batch_grp*(n_grp - 1);

            llama_kv_self_seq_add (ctx, 0, n_past - n_batch,         n_past,         ib*bd);
            llama_kv_self_seq_div (ctx, 0, n_past - n_batch + ib*bd, n_past + ib*bd, n_grp);
            llama_kv_self_update  (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_INF("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));

        if (i + n_batch >= n_tokens_all) {
            break;
        }
    }

    for (int i = n_ctx; i < n_tokens_all; i += n_batch) {
        const int n_discard = n_batch;

        LOG_INF("%s: shifting KV cache with %d\n", __func__, n_discard);

        llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
        llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
      //llama_kv_self_defrag (ctx);
        llama_kv_self_update (ctx);

        n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_ERR("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));
    }

    {
        const int n_discard = n_past - n_ctx + n_predict;

        if (n_discard > 0) {
            LOG_INF("%s: shifting KV cache with %d to free space for the answer\n", __func__, n_discard);

            llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
            llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
          //llama_kv_self_defrag (ctx);
            llama_kv_self_update (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }
    }

    LOG_INF("\n");
    LOG_INF("%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n", __func__, passkey, i_pos, n_junk, (i_pos * n_tokens_all) / n_junk);
    LOG_INF("\n");

    // main loop

    int n_cur    = n_tokens_all;
    int n_decode = 0;

    LOG_INF("%s", prompt_suffix.c_str());

    const auto t_main_start = ggml_time_us();

    while (n_cur <= n_len) {
        // sample the next token
        {
            const llama_token new_token_id = llama_sampler_sample(smpl, ctx, batch.n_tokens - 1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id) || n_cur == n_len) {
                LOG("\n");

                break;
            }

            LOG("%s", common_token_to_piece(ctx, new_token_id).c_str());

            n_decode += 1;

            // prepare the next batch
            common_batch_clear(batch);

            // push this new token for next evaluation
            common_batch_add(batch, new_token_id, n_past++, { 0 }, true);
        }

        n_cur += 1;

        // evaluate the current batch with the transformer model
        if (llama_decode(ctx, batch)) {
            LOG_ERR("%s : failed to eval, return code %d\n", __func__, 1);
            return 1;
        }
    }

    LOG("\n");

    const auto t_main_end = ggml_time_us();

    LOG_INF("%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
            __func__, n_decode, (t_main_end - t_main_start) / 1000000.0f, n_decode / ((t_main_end - t_main_start) / 1000000.0f));

    LOG("\n");
    llama_perf_context_print(ctx);

    LOG("\n");

    llama_sampler_free(smpl);

    llama_batch_free(batch);

    llama_free(ctx);
    llama_model_free(model);

    llama_backend_free();

    return 0;
}